

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols,size_t row)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  Colour local_a1;
  string *local_a0;
  pointer local_98;
  SummaryColumn col;
  string value;
  
  pSVar3 = (cols->super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_98 = (cols->super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = label;
  do {
    if (pSVar3 == local_98) {
      std::operator<<((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                      '\n');
      return;
    }
    SummaryColumn::SummaryColumn(&col,pSVar3);
    std::__cxx11::string::string
              ((string *)&value,
               (string *)
               (col.rows.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + row));
    if (col.label._M_string_length == 0) {
      poVar2 = std::operator<<((ostream *)
                               (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                               (string *)local_a0);
      std::operator<<(poVar2,": ");
      bVar1 = std::operator!=(&value,"0");
      poVar2 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
      if (!bVar1) {
        local_a1.m_moved = false;
        Colour::use(BrightYellow);
        std::operator<<(poVar2,"- none -");
        goto LAB_00160cd0;
      }
      std::operator<<(poVar2,(string *)&value);
    }
    else {
      bVar1 = std::operator!=(&value,"0");
      if (bVar1) {
        poVar2 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        local_a1.m_moved = false;
        Colour::use(FileName);
        std::operator<<(poVar2," | ");
        Colour::~Colour(&local_a1);
        poVar2 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        local_a1.m_moved = false;
        Colour::use(col.colour);
        poVar2 = std::operator<<(poVar2,(string *)&value);
        poVar2 = std::operator<<(poVar2,' ');
        std::operator<<(poVar2,(string *)&col);
LAB_00160cd0:
        Colour::~Colour(&local_a1);
      }
    }
    std::__cxx11::string::~string((string *)&value);
    SummaryColumn::~SummaryColumn(&col);
    pSVar3 = pSVar3 + 1;
  } while( true );
}

Assistant:

void ConsoleReporter::printSummaryRow(std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row) {
    for (auto col : cols) {
        std::string value = col.rows[row];
        if (col.label.empty()) {
            stream << label << ": ";
            if (value != "0")
                stream << value;
            else
                stream << Colour(Colour::Warning) << "- none -";
        } else if (value != "0") {
            stream << Colour(Colour::LightGrey) << " | ";
            stream << Colour(col.colour)
                << value << ' ' << col.label;
        }
    }
    stream << '\n';
}